

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_del_nolock_(event *ev,int blocking)

{
  void *lock_;
  event_base *base;
  short *psVar1;
  unsigned_long uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  unsigned_long uVar6;
  event_debug_entry *peVar7;
  uint u;
  bool bVar8;
  
  if (event_debug_logging_mask_ != 0) {
    event_debugx_("event_del: %p (fd %d), callback %p",ev,(ulong)(uint)ev->ev_fd,
                  (ev->ev_evcallback).evcb_cb_union.evcb_callback);
  }
  if (ev->ev_base == (event_base *)0x0) {
    return -1;
  }
  lock_ = ev->ev_base->th_base_lock;
  if (((lock_ == (void *)0x0) || (evthread_lock_debugging_enabled_ == 0)) ||
     (iVar4 = evthread_is_debug_lock_held_(lock_), iVar4 != 0)) {
    uVar3 = (ev->ev_evcallback).evcb_flags;
    if ((uVar3 & 0x40) != 0 && blocking != 3) {
      return 0;
    }
    if (0xff < uVar3) goto LAB_002487ab;
    base = ev->ev_base;
    if ((((ev->ev_events & 8) != 0) && ((ev->ev_).ev_signal.ev_ncalls != 0)) &&
       (psVar1 = (ev->ev_).ev_signal.ev_pncalls, psVar1 != (short *)0x0)) {
      *psVar1 = 0;
      uVar3 = (ev->ev_evcallback).evcb_flags;
    }
    if ((uVar3 & 1) != 0) {
      event_queue_remove_timeout(base,ev);
      uVar3 = (ev->ev_evcallback).evcb_flags;
    }
    if ((uVar3 & 8) == 0) {
      if ((uVar3 & 0x20) != 0) {
        event_queue_remove_active_later(base,&ev->ev_evcallback);
      }
    }
    else {
      event_queue_remove_active(base,&ev->ev_evcallback);
    }
    uVar3 = (ev->ev_evcallback).evcb_flags;
    iVar4 = 0;
    if ((uVar3 & 2) == 0) {
LAB_002486be:
      if (event_debug_mode_on_ == 0) {
LAB_0024872e:
        event_debug_mode_too_late = 1;
        if (((blocking != 0) &&
            (evthread_id_fn_ != (_func_unsigned_long *)0x0 && (event *)base->current_event == ev))
           && ((uVar2 = base->th_owner_id, uVar6 = (*evthread_id_fn_)(), uVar2 != uVar6 &&
               ((blocking == 1 || ((ev->ev_events & 0x40) == 0)))))) {
          base->current_event_waiters = base->current_event_waiters + 1;
          if (base->current_event_cond != (void *)0x0) {
            (*evthread_cond_fns_.wait_condition)
                      (base->current_event_cond,base->th_base_lock,(timeval *)0x0);
          }
        }
        return iVar4;
      }
      if (event_debug_map_lock_ != (void *)0x0) {
        (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
      }
      if (global_debug_map.hth_table != (event_debug_entry **)0x0) {
        peVar7 = (event_debug_entry *)
                 (global_debug_map.hth_table +
                 ((ulong)ev >> 6 & 0x3ffffff) % (ulong)global_debug_map.hth_table_length);
        do {
          peVar7 = (peVar7->node).hte_next;
          if (peVar7 == (event_debug_entry *)0x0) goto LAB_002487bd;
        } while (peVar7->ptr != ev);
        peVar7->field_0x10 = peVar7->field_0x10 & 0xfe;
        if (event_debug_map_lock_ != (void *)0x0) {
          (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
        }
        goto LAB_0024872e;
      }
      goto LAB_002487bd;
    }
    if ((base->th_base_lock == (void *)0x0) || (evthread_lock_debugging_enabled_ == 0)) {
LAB_00248612:
      if ((uVar3 & 2) != 0) {
        base->event_count = base->event_count - (uint)((uVar3 & 0x10) == 0);
        psVar1 = &(ev->ev_evcallback).evcb_flags;
        *(byte *)psVar1 = (byte)*psVar1 & 0xfd;
        if ((ev->ev_events & 0x86) == 0) {
          iVar5 = evmap_signal_del_(base,ev->ev_fd,ev);
        }
        else {
          iVar5 = evmap_io_del_(base,ev->ev_fd,ev);
        }
        bVar8 = iVar5 == 1;
        iVar4 = 0;
        if (!bVar8) {
          iVar4 = iVar5;
        }
        if ((base->virtual_event_count < 1) && (base->event_count < 1)) {
          bVar8 = base->event_count_active == 0 || iVar5 == 1;
        }
        if ((((bool)(evthread_id_fn_ != (_func_unsigned_long *)0x0 & iVar4 != -1 & bVar8)) &&
            (base->running_loop != 0)) &&
           (uVar2 = base->th_owner_id, uVar6 = (*evthread_id_fn_)(), uVar2 != uVar6)) {
          evthread_notify_base(base);
        }
        goto LAB_002486be;
      }
      goto LAB_002487b0;
    }
    iVar4 = evthread_is_debug_lock_held_(base->th_base_lock);
    if (iVar4 != 0) {
      uVar3 = (ev->ev_evcallback).evcb_flags;
      goto LAB_00248612;
    }
  }
  else {
    event_del_nolock__cold_4();
LAB_002487ab:
    event_del_nolock__cold_1();
LAB_002487b0:
    event_del_nolock__cold_2();
  }
  event_del_nolock__cold_3();
LAB_002487bd:
  event_errx(-0x21522153,
             "%s: noting a del on a non-setup event %p (events: 0x%x, fd: %d, flags: 0x%x)",
             "event_debug_note_del_",ev,(ulong)(uint)(int)ev->ev_events,(ulong)(uint)ev->ev_fd,
             (int)(ev->ev_evcallback).evcb_flags);
}

Assistant:

int
event_del_nolock_(struct event *ev, int blocking)
{
	struct event_base *base;
	int res = 0, notify = 0;

	event_debug(("event_del: %p (fd "EV_SOCK_FMT"), callback %p",
		ev, EV_SOCK_ARG(ev->ev_fd), ev->ev_callback));

	/* An event without a base has not been added */
	if (ev->ev_base == NULL)
		return (-1);

	EVENT_BASE_ASSERT_LOCKED(ev->ev_base);

	if (blocking != EVENT_DEL_EVEN_IF_FINALIZING) {
		if (ev->ev_flags & EVLIST_FINALIZING) {
			/* XXXX Debug */
			return 0;
		}
	}

	base = ev->ev_base;

	EVUTIL_ASSERT(!(ev->ev_flags & ~EVLIST_ALL));

	/* See if we are just active executing this event in a loop */
	if (ev->ev_events & EV_SIGNAL) {
		if (ev->ev_ncalls && ev->ev_pncalls) {
			/* Abort loop */
			*ev->ev_pncalls = 0;
		}
	}

	if (ev->ev_flags & EVLIST_TIMEOUT) {
		/* NOTE: We never need to notify the main thread because of a
		 * deleted timeout event: all that could happen if we don't is
		 * that the dispatch loop might wake up too early.  But the
		 * point of notifying the main thread _is_ to wake up the
		 * dispatch loop early anyway, so we wouldn't gain anything by
		 * doing it.
		 */
		event_queue_remove_timeout(base, ev);
	}

	if (ev->ev_flags & EVLIST_ACTIVE)
		event_queue_remove_active(base, event_to_event_callback(ev));
	else if (ev->ev_flags & EVLIST_ACTIVE_LATER)
		event_queue_remove_active_later(base, event_to_event_callback(ev));

	if (ev->ev_flags & EVLIST_INSERTED) {
		event_queue_remove_inserted(base, ev);
		if (ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED))
			res = evmap_io_del_(base, ev->ev_fd, ev);
		else
			res = evmap_signal_del_(base, (int)ev->ev_fd, ev);
		if (res == 1) {
			/* evmap says we need to notify the main thread. */
			notify = 1;
			res = 0;
		}
		/* If we do not have events, let's notify event base so it can
		 * exit without waiting */
		if (!event_haveevents(base) && !N_ACTIVE_CALLBACKS(base))
			notify = 1;
	}

	/* if we are not in the right thread, we need to wake up the loop */
	if (res != -1 && notify && EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);

	event_debug_note_del_(ev);

	/* If the main thread is currently executing this event's callback,
	 * and we are not the main thread, then we want to wait until the
	 * callback is done before returning. That way, when this function
	 * returns, it will be safe to free the user-supplied argument.
	 */
#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (blocking != EVENT_DEL_NOBLOCK &&
	    base->current_event == event_to_event_callback(ev) &&
	    !EVBASE_IN_THREAD(base) &&
	    (blocking == EVENT_DEL_BLOCK || !(ev->ev_events & EV_FINALIZE))) {
		++base->current_event_waiters;
		EVTHREAD_COND_WAIT(base->current_event_cond, base->th_base_lock);
	}
#endif

	return (res);
}